

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASELoader.cpp
# Opt level: O2

void __thiscall Assimp::ASEImporter::BuildCameras(ASEImporter *this)

{
  float fVar1;
  pointer pCVar2;
  pointer pCVar3;
  aiScene *paVar4;
  ulong __n;
  aiCamera **ppaVar5;
  aiCamera *this_00;
  long lVar6;
  uint i;
  ulong uVar7;
  uint uVar8;
  
  pCVar2 = (this->mParser->m_vCameras).
           super__Vector_base<Assimp::ASE::Camera,_std::allocator<Assimp::ASE::Camera>_>._M_impl.
           super__Vector_impl_data._M_start;
  pCVar3 = (this->mParser->m_vCameras).
           super__Vector_base<Assimp::ASE::Camera,_std::allocator<Assimp::ASE::Camera>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pCVar2 != pCVar3) {
    this->pcScene->mNumCameras = (uint)(((long)pCVar3 - (long)pCVar2) / 0x168);
    paVar4 = this->pcScene;
    ppaVar5 = (aiCamera **)operator_new__((ulong)paVar4->mNumCameras << 3);
    paVar4->mCameras = ppaVar5;
    lVar6 = 0x15c;
    for (uVar7 = 0; uVar7 < this->pcScene->mNumCameras; uVar7 = uVar7 + 1) {
      this_00 = (aiCamera *)operator_new(0x438);
      aiCamera::aiCamera(this_00);
      this->pcScene->mCameras[uVar7] = this_00;
      pCVar2 = (this->mParser->m_vCameras).
               super__Vector_base<Assimp::ASE::Camera,_std::allocator<Assimp::ASE::Camera>_>._M_impl
               .super__Vector_impl_data._M_start;
      this_00->mClipPlaneFar = *(float *)((long)&(pCVar2->super_BaseNode).mType + lVar6);
      fVar1 = *(float *)((long)pCVar2 + lVar6 + -4);
      uVar8 = -(uint)(fVar1 != 0.0);
      this_00->mClipPlaneNear = (float)(~uVar8 & 0x3dcccccd | (uint)fVar1 & uVar8);
      this_00->mHorizontalFOV = *(float *)((long)pCVar2 + lVar6 + -8);
      __n = *(ulong *)((long)pCVar2 + lVar6 + -0x14c);
      if (__n < 0x400) {
        (this_00->mName).length = (ai_uint32)__n;
        memcpy((this_00->mName).data,*(void **)((long)pCVar2 + lVar6 + -0x154),__n);
        (this_00->mName).data[__n] = '\0';
      }
      lVar6 = lVar6 + 0x168;
    }
  }
  return;
}

Assistant:

void ASEImporter::BuildCameras()
{
    if (!mParser->m_vCameras.empty())   {
        pcScene->mNumCameras = (unsigned int)mParser->m_vCameras.size();
        pcScene->mCameras = new aiCamera*[pcScene->mNumCameras];

        for (unsigned int i = 0; i < pcScene->mNumCameras;++i)  {
            aiCamera* out = pcScene->mCameras[i] = new aiCamera();
            ASE::Camera& in = mParser->m_vCameras[i];

            // copy members
            out->mClipPlaneFar  = in.mFar;
            out->mClipPlaneNear = (in.mNear ? in.mNear : 0.1f);
            out->mHorizontalFOV = in.mFOV;

            out->mName.Set(in.mName);
        }
    }
}